

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_qa.cpp
# Opt level: O0

Id dxil_spv::build_live_check(Builder *builder,Id status_id,Id bit_id)

{
  Id IVar1;
  pointer pIVar2;
  pointer pIVar3;
  Block *pBVar4;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_70;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_68;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_60;
  Id local_58;
  undefined4 local_54;
  Id res;
  Id local_4c;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_48;
  __single_object cond;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_38;
  __single_object mask;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_28;
  __single_object shift_up;
  Id u32_type;
  Id bit_id_local;
  Id status_id_local;
  Builder *builder_local;
  
  shift_up._M_t.super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t
  .super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
  super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._4_4_ =
       spv::Builder::makeUintType(builder,0x20);
  mask._M_t.super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
  super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
  super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._4_4_ =
       spv::Builder::getUniqueId(builder);
  mask._M_t.super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
  super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
  super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._0_4_ = 0xc4;
  std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op>
            ((uint *)&local_28,
             (uint *)((long)&mask._M_t.
                             super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                             .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 4),
             (Op *)((long)&shift_up._M_t.
                           super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                           .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 4));
  pIVar2 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                     (&local_28);
  IVar1 = spv::Builder::makeUintConstant(builder,1,false);
  spv::Instruction::addIdOperand(pIVar2,IVar1);
  pIVar2 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                     (&local_28);
  spv::Instruction::addIdOperand(pIVar2,bit_id);
  cond._M_t.super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
  super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
  super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._4_4_ =
       spv::Builder::getUniqueId(builder);
  cond._M_t.super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
  super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
  super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._0_4_ = 199;
  std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op>
            ((uint *)&local_38,
             (uint *)((long)&cond._M_t.
                             super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                             .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 4),
             (Op *)((long)&shift_up._M_t.
                           super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                           .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 4));
  pIVar2 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                     (&local_38);
  spv::Instruction::addIdOperand(pIVar2,status_id);
  pIVar2 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                     (&local_38);
  pIVar3 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                     (&local_28);
  IVar1 = spv::Instruction::getResultId(pIVar3);
  spv::Instruction::addIdOperand(pIVar2,IVar1);
  local_4c = spv::Builder::getUniqueId(builder);
  res = spv::Builder::makeBoolType(builder);
  local_54 = 0xab;
  std::make_unique<spv::Instruction,unsigned_int,unsigned_int,spv::Op>
            ((uint *)&local_48,&local_4c,&res);
  pIVar2 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                     (&local_48);
  pIVar3 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                     (&local_38);
  IVar1 = spv::Instruction::getResultId(pIVar3);
  spv::Instruction::addIdOperand(pIVar2,IVar1);
  pIVar2 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                     (&local_48);
  IVar1 = spv::Builder::makeUintConstant(builder,0,false);
  spv::Instruction::addIdOperand(pIVar2,IVar1);
  pIVar2 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                     (&local_48);
  local_58 = spv::Instruction::getResultId(pIVar2);
  pBVar4 = spv::Builder::getBuildPoint(builder);
  std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::unique_ptr
            (&local_60,&local_28);
  spv::Block::addInstruction(pBVar4,&local_60);
  std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr(&local_60);
  pBVar4 = spv::Builder::getBuildPoint(builder);
  std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::unique_ptr
            (&local_68,&local_38);
  spv::Block::addInstruction(pBVar4,&local_68);
  std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr(&local_68);
  pBVar4 = spv::Builder::getBuildPoint(builder);
  std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::unique_ptr
            (&local_70,&local_48);
  spv::Block::addInstruction(pBVar4,&local_70);
  std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr(&local_70);
  IVar1 = local_58;
  std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr(&local_48);
  std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr(&local_38);
  std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr(&local_28);
  return IVar1;
}

Assistant:

static spv::Id build_live_check(spv::Builder &builder, spv::Id status_id, spv::Id bit_id)
{
	spv::Id u32_type = builder.makeUintType(32);

	auto shift_up = std::make_unique<spv::Instruction>(builder.getUniqueId(), u32_type, spv::OpShiftLeftLogical);
	shift_up->addIdOperand(builder.makeUintConstant(1));
	shift_up->addIdOperand(bit_id);

	auto mask = std::make_unique<spv::Instruction>(builder.getUniqueId(), u32_type, spv::OpBitwiseAnd);
	mask->addIdOperand(status_id);
	mask->addIdOperand(shift_up->getResultId());

	auto cond = std::make_unique<spv::Instruction>(builder.getUniqueId(), builder.makeBoolType(), spv::OpINotEqual);
	cond->addIdOperand(mask->getResultId());
	cond->addIdOperand(builder.makeUintConstant(0));
	spv::Id res = cond->getResultId();

	builder.getBuildPoint()->addInstruction(std::move(shift_up));
	builder.getBuildPoint()->addInstruction(std::move(mask));
	builder.getBuildPoint()->addInstruction(std::move(cond));
	return res;
}